

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void close_state(lua_State *L)

{
  MSize MVar1;
  global_State *g_00;
  size_t sVar2;
  global_State *in_RDI;
  global_State *g;
  TValue *in_stack_ffffffffffffffc8;
  global_State *msp;
  lua_State *in_stack_ffffffffffffffd0;
  
  g_00 = (global_State *)(ulong)in_RDI->strmask;
  lj_func_closeuv(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  lj_gc_freeall(in_RDI);
  lj_trace_freestate(in_RDI);
  lj_ctype_freestate(g_00);
  sVar2 = (ulong)(g_00->strmask + 1) << 2;
  (g_00->gc).total = (g_00->gc).total - (int)sVar2;
  (*g_00->allocf)(g_00->allocd,g_00->strhash,sVar2,0);
  MVar1 = (g_00->tmpbuf).sz;
  (g_00->gc).total = (g_00->gc).total - MVar1;
  (*g_00->allocf)(g_00->allocd,(g_00->tmpbuf).buf,(size_t)MVar1,0);
  MVar1 = (in_RDI->gc).threshold;
  sVar2 = (ulong)(in_RDI->gc).gray.gcptr32 << 3;
  (g_00->gc).total = (g_00->gc).total - (int)sVar2;
  msp = g_00;
  (*g_00->allocf)(g_00->allocd,(void *)MVar1,sVar2,0);
  if (g_00->allocf == lj_alloc_f) {
    lj_alloc_destroy(msp);
  }
  else {
    (*g_00->allocf)(g_00->allocd,g_00[-1].gcroot + 0x16,0x1470,0);
  }
  return;
}

Assistant:

static void close_state(lua_State *L)
{
  global_State *g = G(L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_freeall(g);
  lua_assert(gcref(g->gc.root) == obj2gco(L));
  lua_assert(g->strnum == 0);
  lj_trace_freestate(g);
#if LJ_HASFFI
  lj_ctype_freestate(g);
#endif
  lj_mem_freevec(g, g->strhash, g->strmask+1, GCRef);
  lj_str_freebuf(g, &g->tmpbuf);
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
  lua_assert(g->gc.total == sizeof(GG_State));
#ifndef LUAJIT_USE_SYSMALLOC
  if (g->allocf == lj_alloc_f)
    lj_alloc_destroy(g->allocd);
  else
#endif
    g->allocf(g->allocd, G2GG(g), sizeof(GG_State), 0);
}